

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

base_learner * CSOAA::csldf_setup(options_i *options,vw *all)

{
  long *plVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  pointer plVar5;
  undefined8 uVar6;
  vw_exception *this;
  single_learner *predict;
  vw *pvVar7;
  base_learner *pbVar8;
  vw *in_RSI;
  long *in_RDI;
  learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_> *l;
  prediction_type_t pred_type;
  features fs;
  string loss_function_type;
  stringstream __msg_1;
  stringstream __msg;
  string ldf_arg;
  option_group_definition csldf_inner_options;
  option_group_definition csldf_outer_options;
  string wap_ldf;
  string ldf_override;
  string csoaa_ldf;
  free_ptr<CSOAA::ldf> ld;
  string *in_stack_fffffffffffff3d8;
  prediction_type_t pred_type_00;
  vw *in_stack_fffffffffffff3e0;
  string *in_stack_fffffffffffff3e8;
  base_learner *in_stack_fffffffffffff3f0;
  string *in_stack_fffffffffffff3f8;
  learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_>
  *in_stack_fffffffffffff400;
  undefined7 in_stack_fffffffffffff408;
  undefined1 in_stack_fffffffffffff40f;
  vw_exception *in_stack_fffffffffffff410;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff428;
  option_group_definition *in_stack_fffffffffffff430;
  allocator *paVar9;
  learner<char,_char> *in_stack_fffffffffffff5a0;
  uint64_t in_stack_fffffffffffff5b8;
  unsigned_long *in_stack_fffffffffffff5c0;
  v_hashmap<unsigned_long,_features> *in_stack_fffffffffffff5c8;
  stringstream local_a00 [16];
  ostream local_9f0;
  undefined1 local_871;
  stringstream local_850 [16];
  ostream local_840;
  allocator local_6c1;
  string local_6c0 [39];
  allocator local_699;
  string local_698 [32];
  string local_678 [32];
  undefined4 local_658;
  allocator local_651;
  string local_650 [39];
  allocator local_629;
  string local_628 [39];
  allocator local_601;
  string local_600 [39];
  allocator local_5d9;
  string local_5d8 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5b8;
  allocator local_511;
  string local_510 [32];
  undefined1 local_4f0 [63];
  allocator local_4b1;
  string local_4b0 [39];
  allocator local_489;
  string local_488 [32];
  typed_option<bool> local_468;
  allocator local_3c1;
  string local_3c0 [39];
  allocator local_399;
  string local_398 [32];
  typed_option<bool> local_378;
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [199];
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  allocator local_e1;
  string local_e0 [32];
  undefined1 local_c0 [56];
  string local_88 [32];
  string local_68 [32];
  string local_48 [48];
  vw *local_18;
  long *local_10;
  base_learner *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<CSOAA::ldf>();
  std::__cxx11::string::string(local_48);
  std::__cxx11::string::string(local_68);
  std::__cxx11::string::string(local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e0,"Cost Sensitive One Against All with Label Dependent Features",&local_e1);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"csoaa_ldf",&local_1b9);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff3e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(&local_198,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1e0,"Use one-against-all multiclass learning with label dependent features.",
             &local_1e1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_fffffffffffff430,in_stack_fffffffffffff428);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff3e0);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"ldf_override",&local_2a9);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff3e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2d0,
             "Override singleline or multiline from csoaa_ldf or wap_ldf, eg if stored in file",
             &local_2d1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_fffffffffffff430,in_stack_fffffffffffff428);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff3e0);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"csoaa_rank",&local_399);
  std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x39b3f3);
  VW::config::make_option<bool>(in_stack_fffffffffffff3e8,(bool *)in_stack_fffffffffffff3e0);
  VW::config::typed_option<bool>::keep(&local_378,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"Return actions sorted by score order",&local_3c1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff430,(typed_option<bool> *)in_stack_fffffffffffff428);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff3e0);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_488,"probabilities",&local_489);
  std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x39b51a);
  VW::config::make_option<bool>(in_stack_fffffffffffff3e8,(bool *)in_stack_fffffffffffff3e0);
  VW::config::typed_option<bool>::keep(&local_468,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b0,"predict probabilites of all classes",&local_4b1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff430,(typed_option<bool> *)in_stack_fffffffffffff428);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff3e0);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_510,"Cost Sensitive One Against All with Label Dependent Features",&local_511);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8);
  std::__cxx11::string::~string(local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5d8,"wap_ldf",&local_5d9);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff3e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff3e0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(&local_5b8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_600,
             "Use weighted all-pairs multiclass learning with label dependent features.  Specify singleline or multiline."
             ,&local_601);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_fffffffffffff430,in_stack_fffffffffffff428);
  std::__cxx11::string::~string(local_600);
  std::allocator<char>::~allocator((allocator<char> *)&local_601);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff3e0);
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  (**(code **)*local_10)(local_10,local_c0);
  plVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_628,"csoaa_ldf",&local_629);
  bVar2 = (**(code **)(*plVar1 + 8))(plVar1,local_628);
  std::__cxx11::string::~string(local_628);
  std::allocator<char>::~allocator((allocator<char> *)&local_629);
  if (((bVar2 ^ 0xff) & 1) != 0) {
    (**(code **)*local_10)(local_10,local_4f0);
    plVar1 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_650,"wap_ldf",&local_651);
    bVar2 = (**(code **)(*plVar1 + 8))(plVar1,local_650);
    std::__cxx11::string::~string(local_650);
    std::allocator<char>::~allocator((allocator<char> *)&local_651);
    if (((bVar2 ^ 0xff) & 1) != 0) {
      local_8 = (base_learner *)0x0;
      local_658 = 1;
      goto LAB_0039c6d3;
    }
  }
  pvVar7 = local_18;
  plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                     ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x39bdd9);
  plVar5->all = pvVar7;
  plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                     ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x39bdef);
  plVar5->first_pass = true;
  std::__cxx11::string::string(local_678);
  plVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_698,"csoaa_ldf",&local_699);
  bVar2 = (**(code **)(*plVar1 + 8))(plVar1,local_698);
  std::__cxx11::string::~string(local_698);
  std::allocator<char>::~allocator((allocator<char> *)&local_699);
  if ((bVar2 & 1) == 0) {
    std::__cxx11::string::operator=(local_678,local_88);
    plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                       ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x39bf25);
    plVar5->is_wap = true;
  }
  else {
    std::__cxx11::string::operator=(local_678,local_48);
  }
  paVar9 = &local_6c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6c0,"ldf_override",paVar9);
  bVar2 = (**(code **)(*local_10 + 8))(local_10,local_6c0);
  std::__cxx11::string::~string(local_6c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
  if ((bVar2 & 1) != 0) {
    std::__cxx11::string::operator=(local_678,local_68);
  }
  plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                     ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x39c015);
  if ((plVar5->rank & 1U) != 0) {
    local_18->delete_prediction = ACTION_SCORE::delete_action_scores;
  }
  memcpy(&local_18->p->lp,&COST_SENSITIVE::cs_label,0x48);
  local_18->label_type = cs;
  plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                     ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x39c077);
  plVar5->treat_as_classifier = false;
  iVar4 = std::__cxx11::string::compare((char *)local_678);
  if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)local_678), iVar4 == 0)) {
    plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                       ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x39c0bd);
    plVar5->treat_as_classifier = false;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)local_678);
    if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)local_678), iVar4 == 0)) {
      plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                         ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x39c108);
      plVar5->treat_as_classifier = true;
    }
    else {
      if ((local_18->training & 1U) != 0) {
        std::__cxx11::stringstream::stringstream(local_850);
        iVar4 = (int)((ulong)in_stack_fffffffffffff400 >> 0x20);
        std::operator<<(&local_840,"ldf requires either m/multiline or mc/multiline-classifier");
        local_871 = 1;
        uVar6 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (in_stack_fffffffffffff410,
                   (char *)CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),iVar4,
                   in_stack_fffffffffffff3f8);
        local_871 = 0;
        __cxa_throw(uVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      iVar4 = std::__cxx11::string::compare((char *)local_678);
      if ((((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)local_678), iVar4 == 0))
          || (iVar4 = std::__cxx11::string::compare((char *)local_678), iVar4 == 0)) ||
         (iVar4 = std::__cxx11::string::compare((char *)local_678), iVar4 == 0)) {
        iVar4 = (int)((ulong)in_stack_fffffffffffff400 >> 0x20);
        std::__cxx11::stringstream::stringstream(local_a00);
        std::operator<<(&local_9f0,
                        "ldf requires either m/multiline or mc/multiline-classifier.  s/sc/singleline/singleline-classifier is no longer supported"
                       );
        this = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (this,(char *)CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),iVar4,
                   in_stack_fffffffffffff3f8);
        __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
  }
  plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                     ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x39c3c0);
  if ((plVar5->is_probabilities & 1U) != 0) {
    local_18->sd->report_multiclass_log_loss = true;
    (**local_18->loss->_vptr_loss_function)(&stack0xfffffffffffff5b8);
    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff3e0,(char *)in_stack_fffffffffffff3d8);
    if (bVar3) {
      in_stack_fffffffffffff400 =
           (learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_> *)
           std::operator<<(&(local_18->trace_message).super_ostream,
                           "WARNING: --probabilities should be used only with --loss_function=logistic"
                          );
      std::ostream::operator<<(in_stack_fffffffffffff400,std::endl<char,std::char_traits<char>>);
    }
    plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                       ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x39c48e);
    if ((plVar5->treat_as_classifier & 1U) == 0) {
      in_stack_fffffffffffff3f8 =
           (string *)
           std::operator<<(&(local_18->trace_message).super_ostream,
                           "WARNING: --probabilities should be used with --csoaa_ldf=mc (or --oaa)")
      ;
      std::ostream::operator<<(in_stack_fffffffffffff3f8,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff5b8);
  }
  pred_type_00 = (prediction_type_t)((ulong)in_stack_fffffffffffff3d8 >> 0x20);
  local_18->p->emptylines_separate_examples = true;
  features::features((features *)pvVar7);
  plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                     ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x39c50a);
  v_hashmap<unsigned_long,_features>::init(&plVar5->label_features,(EVP_PKEY_CTX *)0x100);
  std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
            ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x39c535);
  v_hashmap<unsigned_long,_features>::get
            (in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                     ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x39c565);
  if ((plVar5->rank & 1U) == 0) {
    std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
              ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x39c588);
  }
  plVar5 = std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::operator->
                     ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)0x39c5b8);
  plVar5->read_example_this_loop = 0;
  in_stack_fffffffffffff3f0 =
       setup_base((options_i *)in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e0);
  predict = LEARNER::as_singleline<char,char>(in_stack_fffffffffffff5a0);
  pvVar7 = (vw *)LEARNER::
                 init_learner<CSOAA::ldf,std::vector<example*,std::allocator<example*>>,LEARNER::learner<char,example>>
                           ((free_ptr<CSOAA::ldf> *)in_stack_fffffffffffff400,
                            (learner<char,_example> *)in_stack_fffffffffffff3f8,
                            (_func_void_ldf_ptr_learner<char,_example>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                             *)in_stack_fffffffffffff3f0,
                            (_func_void_ldf_ptr_learner<char,_example>_ptr_vector<example_ptr,_std::allocator<example_ptr>_>_ptr
                             *)predict,(size_t)in_stack_fffffffffffff3e0,pred_type_00);
  in_stack_fffffffffffff3e0 = pvVar7;
  LEARNER::learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_>::
  set_finish_example((learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_> *)
                     pvVar7,finish_multiline_example);
  LEARNER::learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_>::set_finish
            (in_stack_fffffffffffff400,(_func_void_ldf_ptr *)in_stack_fffffffffffff3f8);
  LEARNER::learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_>::set_end_pass
            (in_stack_fffffffffffff400,(_func_void_ldf_ptr *)in_stack_fffffffffffff3f8);
  pbVar8 = LEARNER::make_base<CSOAA::ldf,std::vector<example*,std::allocator<example*>>>
                     ((learner<CSOAA::ldf,_std::vector<example_*,_std::allocator<example_*>_>_> *)
                      pvVar7);
  local_18->cost_sensitive = pbVar8;
  local_8 = local_18->cost_sensitive;
  local_658 = 1;
  std::__cxx11::string::~string(local_678);
LAB_0039c6d3:
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff3e0);
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff3e0);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  std::unique_ptr<CSOAA::ldf,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<CSOAA::ldf,_void_(*)(void_*)> *)in_stack_fffffffffffff3f0);
  return local_8;
}

Assistant:

base_learner* csldf_setup(options_i& options, vw& all)
{
  auto ld = scoped_calloc_or_throw<ldf>();

  std::string csoaa_ldf;
  std::string ldf_override;
  std::string wap_ldf;

  option_group_definition csldf_outer_options("Cost Sensitive One Against All with Label Dependent Features");
  csldf_outer_options.add(make_option("csoaa_ldf", csoaa_ldf)
                              .keep()
                              .help("Use one-against-all multiclass learning with label dependent features."));
  csldf_outer_options.add(
      make_option("ldf_override", ldf_override)
          .help("Override singleline or multiline from csoaa_ldf or wap_ldf, eg if stored in file"));
  csldf_outer_options.add(make_option("csoaa_rank", ld->rank).keep().help("Return actions sorted by score order"));
  csldf_outer_options.add(
      make_option("probabilities", ld->is_probabilities).keep().help("predict probabilites of all classes"));

  option_group_definition csldf_inner_options("Cost Sensitive One Against All with Label Dependent Features");
  csldf_inner_options.add(make_option("wap_ldf", wap_ldf)
                              .keep()
                              .help("Use weighted all-pairs multiclass learning with label dependent features.  "
                                    "Specify singleline or multiline."));

  options.add_and_parse(csldf_outer_options);
  if (!options.was_supplied("csoaa_ldf"))
  {
    options.add_and_parse(csldf_inner_options);
    if (!options.was_supplied("wap_ldf"))
    {
      return nullptr;
    }
  }

  ld->all = &all;
  ld->first_pass = true;

  string ldf_arg;

  if (options.was_supplied("csoaa_ldf"))
    ldf_arg = csoaa_ldf;
  else
  {
    ldf_arg = wap_ldf;
    ld->is_wap = true;
  }
  if (options.was_supplied("ldf_override"))
    ldf_arg = ldf_override;
  if (ld->rank)
    all.delete_prediction = delete_action_scores;

  all.p->lp = COST_SENSITIVE::cs_label;
  all.label_type = label_type::cs;

  ld->treat_as_classifier = false;
  if (ldf_arg.compare("multiline") == 0 || ldf_arg.compare("m") == 0)
    ld->treat_as_classifier = false;
  else if (ldf_arg.compare("multiline-classifier") == 0 || ldf_arg.compare("mc") == 0)
    ld->treat_as_classifier = true;
  else
  {
    if (all.training)
      THROW("ldf requires either m/multiline or mc/multiline-classifier");
    if ((ldf_arg.compare("singleline") == 0 || ldf_arg.compare("s") == 0) ||
        (ldf_arg.compare("singleline-classifier") == 0 || ldf_arg.compare("sc") == 0))
      THROW(
          "ldf requires either m/multiline or mc/multiline-classifier.  s/sc/singleline/singleline-classifier is no "
          "longer supported");
  }

  if (ld->is_probabilities)
  {
    all.sd->report_multiclass_log_loss = true;
    auto loss_function_type = all.loss->getType();
    if (loss_function_type != "logistic")
      all.trace_message << "WARNING: --probabilities should be used only with --loss_function=logistic" << endl;
    if (!ld->treat_as_classifier)
      all.trace_message << "WARNING: --probabilities should be used with --csoaa_ldf=mc (or --oaa)" << endl;
  }

  all.p->emptylines_separate_examples = true;  // TODO: check this to be sure!!!  !ld->is_singleline;

  features fs;
  ld->label_features.init(256, fs, LabelDict::size_t_eq);
  ld->label_features.get(1, 94717244);  // TODO: figure this out
  prediction_type::prediction_type_t pred_type;

  if (ld->rank)
    pred_type = prediction_type::action_scores;
  else if (ld->is_probabilities)
    pred_type = prediction_type::prob;
  else
    pred_type = prediction_type::multiclass;

  ld->read_example_this_loop = 0;
  learner<ldf, multi_ex>& l = init_learner(ld, as_singleline(setup_base(*all.options, all)), do_actual_learning<true>,
      do_actual_learning<false>, 1, pred_type);
  l.set_finish_example(finish_multiline_example);
  l.set_finish(finish);
  l.set_end_pass(end_pass);
  all.cost_sensitive = make_base(l);
  return all.cost_sensitive;
}